

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall b2r::result(b2r *this,context *ctx,token *token,opcode *op)

{
  int iVar1;
  token local_50;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  local_28 = op;
  op_local = (opcode *)token;
  token_local = (token *)ctx;
  ctx_local = (context *)this;
  iVar1 = equal(token,".RESULT");
  if (iVar1 == 0) {
    fail((token *)this,(char *)op_local,"expected .RESULT");
  }
  else {
    context::tokenize(&local_50,(context *)token_local);
    memcpy(op_local,&local_50,0x24);
    opcode::add_bits(local_28,0xd00000000);
    opcode::add_bits(local_28,0xff00);
    memset(this,0,8);
    error::error((error *)this);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(result)
    {
        if (!equal(token, ".RESULT")) {
            return fail(token, "expected .RESULT");
        }
        token = ctx.tokenize();
        op.add_bits(0xDULL << 32);
        op.add_bits(0xFFULL << 8);
        return {};
    }